

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

char * sh4asm_tok_as_str(sh4asm_tok *tk)

{
  tok_tp *ptVar1;
  uint uVar2;
  sh4asm_tok_mapping *psVar3;
  char *pcVar4;
  
  uVar2 = tk->tp - SH4ASM_TOK_RN;
  if ((uVar2 < 9) && ((0x1bfU >> (uVar2 & 0x1f) & 1) != 0)) {
    pcVar4 = sh4asm_tok_as_str::buf;
    snprintf(sh4asm_tok_as_str::buf,0x20,&DAT_0010eef0 + *(int *)(&DAT_0010eef0 + (ulong)uVar2 * 4),
             (ulong)(uint)(tk->val).as_int);
    sh4asm_tok_as_str::buf[0x1f] = '\0';
  }
  else {
    psVar3 = tok_map;
    do {
      pcVar4 = psVar3->txt;
      if (pcVar4 == (char *)0x0) {
        return (char *)0x0;
      }
      ptVar1 = &psVar3->tok;
      psVar3 = psVar3 + 1;
    } while (*ptVar1 != tk->tp);
  }
  return pcVar4;
}

Assistant:

char const *sh4asm_tok_as_str(struct sh4asm_tok const *tk) {
    static char buf[SH4ASM_TOK_LEN_MAX];

    if (tk->tp == SH4ASM_TOK_IMM) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "#0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_RN_BANK) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "r%u_bank", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DRN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "dr%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_XDN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "xd%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_FVN) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "fv%u", tk->val.reg_idx);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    } else if (tk->tp == SH4ASM_TOK_DISP) {
        snprintf(buf, SH4ASM_TOK_LEN_MAX, "0x%x", tk->val.as_int);
        buf[SH4ASM_TOK_LEN_MAX - 1] = '\0';
        return buf;
    }

    struct sh4asm_tok_mapping const *curs = tok_map;
    while (curs->txt) {
        if (curs->tok == tk->tp)
            return curs->txt;
        curs++;
    }

    return NULL;
}